

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildAndroidMKGenerator.cxx
# Opt level: O3

void cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties
               (cmGeneratorTarget *target,ostream *os,ImportPropertyMap *properties,
               GenerateType type,string *config)

{
  cmMakefile *this;
  cmLinkItem *pcVar1;
  cmGeneratorTarget *pcVar2;
  undefined8 uVar3;
  _Rb_tree_node_base *p_Var4;
  bool bVar5;
  PolicyStatus PVar6;
  int iVar7;
  TargetType TVar8;
  string *psVar9;
  ostream *poVar10;
  cmLinkInterfaceLibraries *pcVar11;
  _Base_ptr p_Var12;
  cmLinkImplementation *pcVar13;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var14;
  _Base_ptr p_Var15;
  cmLinkItem *this_00;
  char *pcVar16;
  _func_int **pp_Var17;
  string *i;
  pointer pbVar18;
  _Rb_tree_node_base *p_Var19;
  bool bVar20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkFlagsList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includeList;
  ostringstream w;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  GenerateType local_1ec;
  undefined1 local_1e8 [32];
  string *local_1c8;
  _Rb_tree_node_base *local_1c0;
  cmGeneratorTarget *local_1b8;
  ostream *local_1b0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_1ec = type;
  local_1c8 = config;
  PVar6 = cmPolicies::PolicyMap::Get(&target->PolicyMap,CMP0022);
  if ((PVar6 == WARN) ||
     (PVar6 = cmPolicies::PolicyMap::Get(&target->PolicyMap,CMP0022), PVar6 == OLD)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar16 = "install( EXPORT_ANDROID_MK ...) called with policy CMP0022";
    if (local_1ec == BUILD) {
      pcVar16 = "export(TARGETS ... ANDROID_MK) called with policy CMP0022";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,pcVar16,(ulong)(local_1ec != BUILD) + 0x39);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," set to OLD for target ",0x17);
    psVar9 = cmTarget::GetName_abi_cxx11_(target->Target);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,". ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"The export will only work with CMP0022 set to NEW.",0x32);
    this = target->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(this,AUTHOR_WARNING,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if ((properties->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"LOCAL_CPP_FEATURES := rtti exceptions\n",0x26);
    p_Var12 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var19 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
    p_Var4 = p_Var19;
    pcVar2 = target;
    poVar10 = os;
    if (p_Var12 != p_Var19) {
      do {
        local_1b0 = poVar10;
        local_1b8 = pcVar2;
        local_1c0 = p_Var4;
        pp_Var17 = (_func_int **)(local_1a8 + 0x10);
        p_Var4 = p_Var12 + 1;
        iVar7 = std::__cxx11::string::compare((char *)p_Var4);
        if (iVar7 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"LOCAL_CPP_FEATURES += ",0x16);
          pcVar16 = *(char **)(p_Var12 + 2);
          p_Var15 = p_Var12[2]._M_parent;
          poVar10 = os;
LAB_002a71a5:
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,pcVar16,(long)p_Var15);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)p_Var4);
          if (iVar7 == 0) {
            local_1a8._8_8_ = 0;
            local_198[0]._M_local_buf[0] = '\0';
            local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
            local_238._M_string_length = 0;
            local_238.field_2._M_allocated_capacity =
                 local_238.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_1e8._0_8_ = local_1e8 + 0x10;
            local_1e8._8_8_ = (pointer)0x0;
            local_1e8._16_8_ = local_1e8._16_8_ & 0xffffffffffffff00;
            local_1a8._0_8_ = pp_Var17;
            pcVar11 = cmGeneratorTarget::GetLinkInterfaceLibraries(target,local_1c8,target,false);
            pcVar1 = (pcVar11->Libraries).
                     super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            os = local_1b0;
            for (this_00 = (pcVar11->Libraries).
                           super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                           super__Vector_impl_data._M_start; local_1b0 = os, this_00 != pcVar1;
                this_00 = this_00 + 1) {
              pcVar2 = this_00->Target;
              psVar9 = cmLinkItem::AsStr_abi_cxx11_(this_00);
              if (pcVar2 == (cmGeneratorTarget *)0x0) {
                if (local_1ec == INSTALL) {
                  std::__cxx11::string::substr((ulong)&local_210,(ulong)psVar9);
                  iVar7 = std::__cxx11::string::compare((char *)&local_210);
                  bVar20 = iVar7 == 0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_210._M_dataplus._M_p != &local_210.field_2) {
                    operator_delete(local_210._M_dataplus._M_p,
                                    local_210.field_2._M_allocated_capacity + 1);
                  }
                }
                else {
                  bVar20 = false;
                }
                bVar5 = cmsys::SystemTools::FileIsFullPath(psVar9);
                if (bVar5) {
LAB_002a7331:
                  std::operator+(&local_210," ",psVar9);
                  std::__cxx11::string::_M_append(local_1e8,(ulong)local_210._M_dataplus._M_p);
                  goto LAB_002a73b7;
                }
                std::__cxx11::string::substr((ulong)&local_210,(ulong)psVar9);
                iVar7 = std::__cxx11::string::compare((char *)&local_210);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_210._M_dataplus._M_p != &local_210.field_2) {
                  operator_delete(local_210._M_dataplus._M_p,
                                  local_210.field_2._M_allocated_capacity + 1);
                }
                if (bVar20 || iVar7 == 0) goto LAB_002a7331;
                if (psVar9->_M_string_length != 0) {
                  std::operator+(&local_210," -l",psVar9);
                  std::__cxx11::string::_M_append(local_1e8,(ulong)local_210._M_dataplus._M_p);
                  goto LAB_002a73b7;
                }
              }
              else {
                TVar8 = cmGeneratorTarget::GetType(pcVar2);
                if ((TVar8 == SHARED_LIBRARY) ||
                   (TVar8 = cmGeneratorTarget::GetType(pcVar2), TVar8 == MODULE_LIBRARY)) {
                  std::operator+(&local_210," ",psVar9);
                  std::__cxx11::string::_M_append
                            ((char *)&local_238,(ulong)local_210._M_dataplus._M_p);
                }
                else {
                  std::operator+(&local_210," ",psVar9);
                  std::__cxx11::string::_M_append(local_1a8,(ulong)local_210._M_dataplus._M_p);
                }
LAB_002a73b7:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_210._M_dataplus._M_p != &local_210.field_2) {
                  operator_delete(local_210._M_dataplus._M_p,
                                  local_210.field_2._M_allocated_capacity + 1);
                }
              }
              os = local_1b0;
            }
            if ((char *)local_238._M_string_length != (char *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (os,"LOCAL_SHARED_LIBRARIES :=",0x19);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (os,local_238._M_dataplus._M_p,local_238._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            }
            if (local_1a8._8_8_ != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (os,"LOCAL_STATIC_LIBRARIES :=",0x19);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (os,(char *)local_1a8._0_8_,local_1a8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            }
            if ((pointer)local_1e8._8_8_ != (pointer)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>(os,"LOCAL_EXPORT_LDLIBS :=",0x16);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (os,(char *)local_1e8._0_8_,local_1e8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            }
            target = local_1b8;
            p_Var19 = local_1c0;
            if ((pointer)local_1e8._0_8_ != (pointer)(local_1e8 + 0x10)) {
              operator_delete((void *)local_1e8._0_8_,
                              (ulong)((long)&((_Alloc_hider *)local_1e8._16_8_)->_M_p + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != &local_238.field_2) {
              operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)p_Var4);
            if (iVar7 != 0) {
              iVar7 = std::__cxx11::string::compare((char *)p_Var4);
              if (iVar7 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>(os,"# ",2);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (os,*(char **)(p_Var12 + 1),(long)p_Var12[1]._M_parent);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                pcVar16 = *(char **)(p_Var12 + 2);
                p_Var15 = p_Var12[2]._M_parent;
                goto LAB_002a71a5;
              }
              std::__ostream_insert<char,std::char_traits<char>>(os,"LOCAL_EXPORT_LDFLAGS := ",0x18)
              ;
              local_238._M_dataplus._M_p = (pointer)0x0;
              local_238._M_string_length = 0;
              local_238.field_2._M_allocated_capacity = 0;
              cmSystemTools::ExpandListArgument
                        ((string *)(p_Var12 + 2),
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_238,false);
              cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((string *)local_1a8,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_238," ");
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (os,(char *)local_1a8._0_8_,local_1a8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if ((_func_int **)local_1a8._0_8_ != pp_Var17) {
                operator_delete((void *)local_1a8._0_8_,
                                CONCAT71(local_198[0]._M_allocated_capacity._1_7_,
                                         local_198[0]._M_local_buf[0]) + 1);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_238);
              goto LAB_002a76c6;
            }
            local_1a8._0_8_ = pp_Var17;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1a8,*(long *)(p_Var12 + 2),
                       (long)&(p_Var12[2]._M_parent)->_M_color + *(long *)(p_Var12 + 2));
            local_1e8._0_8_ = (pointer)0x0;
            local_1e8._8_8_ = (pointer)0x0;
            local_1e8._16_8_ = (pointer)0x0;
            cmSystemTools::ExpandListArgument
                      ((string *)local_1a8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1e8,false);
            std::__ostream_insert<char,std::char_traits<char>>
                      (os,"LOCAL_EXPORT_C_INCLUDES := ",0x1b);
            uVar3 = local_1e8._8_8_;
            local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
            local_238._M_string_length = 0;
            local_238.field_2._M_allocated_capacity =
                 local_238.field_2._M_allocated_capacity & 0xffffffffffffff00;
            for (pbVar18 = (pointer)local_1e8._0_8_; pbVar18 != (pointer)uVar3;
                pbVar18 = pbVar18 + 1) {
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (os,local_238._M_dataplus._M_p,local_238._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(pbVar18->_M_dataplus)._M_p,pbVar18->_M_string_length);
              std::__cxx11::string::_M_replace
                        ((ulong)&local_238,0,(char *)local_238._M_string_length,0x55875e);
            }
            std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
            p_Var19 = local_1c0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != &local_238.field_2) {
              operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1
                             );
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1e8);
          }
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,
                            CONCAT71(local_198[0]._M_allocated_capacity._1_7_,
                                     local_198[0]._M_local_buf[0]) + 1);
          }
        }
LAB_002a76c6:
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
        p_Var4 = local_1c0;
        pcVar2 = local_1b8;
        poVar10 = local_1b0;
      } while (p_Var12 != p_Var19);
    }
  }
  TVar8 = cmGeneratorTarget::GetType(target);
  if (TVar8 == STATIC_LIBRARY) {
    pcVar13 = cmGeneratorTarget::GetLinkImplementation(target,local_1c8);
    _Var14 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[4]>>
                       ((pcVar13->Languages).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (pcVar13->Languages).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,"CXX");
    if (_Var14._M_current !=
        (pcVar13->Languages).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"LOCAL_HAS_CPP := true\n",0x16);
    }
  }
  TVar8 = cmGeneratorTarget::GetType(target);
  if (TVar8 - STATIC_LIBRARY < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,&DAT_00532368 + *(int *)(&DAT_00532368 + (ulong)(TVar8 - STATIC_LIBRARY) * 4),0x23
              );
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  return;
}

Assistant:

void cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties(
  const cmGeneratorTarget* target, std::ostream& os,
  const ImportPropertyMap& properties, GenerateType type,
  std::string const& config)
{
  const bool newCMP0022Behavior =
    target->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
    target->GetPolicyStatusCMP0022() != cmPolicies::OLD;
  if (!newCMP0022Behavior) {
    std::ostringstream w;
    if (type == cmExportBuildAndroidMKGenerator::BUILD) {
      w << "export(TARGETS ... ANDROID_MK) called with policy CMP0022";
    } else {
      w << "install( EXPORT_ANDROID_MK ...) called with policy CMP0022";
    }
    w << " set to OLD for target " << target->Target->GetName() << ". "
      << "The export will only work with CMP0022 set to NEW.";
    target->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
  }
  if (!properties.empty()) {
    os << "LOCAL_CPP_FEATURES := rtti exceptions\n";
    for (auto const& property : properties) {
      if (property.first == "INTERFACE_COMPILE_OPTIONS") {
        os << "LOCAL_CPP_FEATURES += ";
        os << (property.second) << "\n";
      } else if (property.first == "INTERFACE_LINK_LIBRARIES") {
        std::string staticLibs;
        std::string sharedLibs;
        std::string ldlibs;
        cmLinkInterfaceLibraries const* linkIFace =
          target->GetLinkInterfaceLibraries(config, target, false);
        for (cmLinkItem const& item : linkIFace->Libraries) {
          cmGeneratorTarget const* gt = item.Target;
          std::string const& lib = item.AsStr();
          if (gt) {

            if (gt->GetType() == cmStateEnums::SHARED_LIBRARY ||
                gt->GetType() == cmStateEnums::MODULE_LIBRARY) {
              sharedLibs += " " + lib;
            } else {
              staticLibs += " " + lib;
            }
          } else {
            bool relpath = false;
            if (type == cmExportBuildAndroidMKGenerator::INSTALL) {
              relpath = lib.substr(0, 3) == "../";
            }
            // check for full path or if it already has a -l, or
            // in the case of an install check for relative paths
            // if it is full or a link library then use string directly
            if (cmSystemTools::FileIsFullPath(lib) ||
                lib.substr(0, 2) == "-l" || relpath) {
              ldlibs += " " + lib;
              // if it is not a path and does not have a -l then add -l
            } else if (!lib.empty()) {
              ldlibs += " -l" + lib;
            }
          }
        }
        if (!sharedLibs.empty()) {
          os << "LOCAL_SHARED_LIBRARIES :=" << sharedLibs << "\n";
        }
        if (!staticLibs.empty()) {
          os << "LOCAL_STATIC_LIBRARIES :=" << staticLibs << "\n";
        }
        if (!ldlibs.empty()) {
          os << "LOCAL_EXPORT_LDLIBS :=" << ldlibs << "\n";
        }
      } else if (property.first == "INTERFACE_INCLUDE_DIRECTORIES") {
        std::string includes = property.second;
        std::vector<std::string> includeList;
        cmSystemTools::ExpandListArgument(includes, includeList);
        os << "LOCAL_EXPORT_C_INCLUDES := ";
        std::string end;
        for (std::string const& i : includeList) {
          os << end << i;
          end = "\\\n";
        }
        os << "\n";
      } else if (property.first == "INTERFACE_LINK_OPTIONS") {
        os << "LOCAL_EXPORT_LDFLAGS := ";
        std::vector<std::string> linkFlagsList;
        cmSystemTools::ExpandListArgument(property.second, linkFlagsList);
        os << cmJoin(linkFlagsList, " ") << "\n";
      } else {
        os << "# " << property.first << " " << (property.second) << "\n";
      }
    }
  }

  // Tell the NDK build system if prebuilt static libraries use C++.
  if (target->GetType() == cmStateEnums::STATIC_LIBRARY) {
    cmLinkImplementation const* li = target->GetLinkImplementation(config);
    if (std::find(li->Languages.begin(), li->Languages.end(), "CXX") !=
        li->Languages.end()) {
      os << "LOCAL_HAS_CPP := true\n";
    }
  }

  switch (target->GetType()) {
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      os << "include $(PREBUILT_SHARED_LIBRARY)\n";
      break;
    case cmStateEnums::STATIC_LIBRARY:
      os << "include $(PREBUILT_STATIC_LIBRARY)\n";
      break;
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::UTILITY:
    case cmStateEnums::OBJECT_LIBRARY:
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::INTERFACE_LIBRARY:
    case cmStateEnums::UNKNOWN_LIBRARY:
      break;
  }
  os << "\n";
}